

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optim_mir.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> *
pred_intersection(map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
                  *nodes,int n,
                 map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                 *dom)

{
  BasicBlock *pBVar1;
  bool bVar2;
  pointer ppVar3;
  size_type sVar4;
  vector<int,_std::allocator<int>_> *__x;
  vector<int,_std::allocator<int>_> *pvVar5;
  vector<int,_std::allocator<int>_> *in_RDI;
  int i;
  vector<int,_std::allocator<int>_> v2;
  vector<int,_std::allocator<int>_> v1;
  iterator iter;
  BasicBlock *b;
  iterator it;
  vector<int,_std::allocator<int>_> *v;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  *in_stack_fffffffffffffe48;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe50;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe58;
  iterator in_stack_fffffffffffffe60;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe98;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffea0;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffee0;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffee8;
  int local_e4;
  _Self local_30;
  _Self local_28 [5];
  
  local_28[0]._M_node =
       (_Base_ptr)
       std::
       map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
       ::find((map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
               *)in_stack_fffffffffffffe48,(key_type *)0x27df82);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
       ::end((map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
              *)in_stack_fffffffffffffe48);
  bVar2 = std::operator!=(local_28,&local_30);
  if (bVar2) {
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>::
             operator->((_Rb_tree_iterator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_> *)
                        0x27dfc7);
    pBVar1 = ppVar3->second;
    std::
    map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
    ::find(in_stack_fffffffffffffe48,(key_type *)0x27dfe5);
    std::_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>::
    operator->((_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_> *)
               0x27dffa);
    std::vector<int,_std::allocator<int>_>::vector
              (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    sVar4 = std::
            vector<front::optim_mir::BasicBlock_*,_std::allocator<front::optim_mir::BasicBlock_*>_>
            ::size(&pBVar1->preBlock);
    if (sVar4 == 1) {
      std::vector<front::optim_mir::BasicBlock_*,_std::allocator<front::optim_mir::BasicBlock_*>_>::
      operator[](&pBVar1->preBlock,0);
      std::
      map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
      ::find(in_stack_fffffffffffffe48,(key_type *)0x27e04b);
      std::vector<int,_std::allocator<int>_>::vector
                (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      std::_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>::
      operator->((_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                  *)0x27e093);
      std::vector<int,_std::allocator<int>_>::vector
                (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      vectors_set_union(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
      std::vector<int,_std::allocator<int>_>::operator=
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe60._M_node,
                 in_stack_fffffffffffffe58);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe60._M_node);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe60._M_node);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe60._M_node);
      std::vector<int,_std::allocator<int>_>::vector
                (in_stack_fffffffffffffe50,
                 (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe48);
      bVar2 = true;
    }
    else {
      sVar4 = std::
              vector<front::optim_mir::BasicBlock_*,_std::allocator<front::optim_mir::BasicBlock_*>_>
              ::size(&pBVar1->preBlock);
      if (sVar4 < 2) {
        bVar2 = false;
      }
      else {
        std::vector<front::optim_mir::BasicBlock_*,_std::allocator<front::optim_mir::BasicBlock_*>_>
        ::operator[](&pBVar1->preBlock,0);
        in_stack_fffffffffffffe60 =
             std::
             map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
             ::find(in_stack_fffffffffffffe48,(key_type *)0x27e1c5);
        std::_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>::
        operator->((_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                    *)0x27e1f6);
        std::vector<int,_std::allocator<int>_>::vector
                  (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
        local_e4 = 1;
        while( true ) {
          __x = (vector<int,_std::allocator<int>_> *)(long)local_e4;
          pvVar5 = (vector<int,_std::allocator<int>_> *)
                   std::
                   vector<front::optim_mir::BasicBlock_*,_std::allocator<front::optim_mir::BasicBlock_*>_>
                   ::size(&pBVar1->preBlock);
          if (pvVar5 <= __x) break;
          std::
          vector<front::optim_mir::BasicBlock_*,_std::allocator<front::optim_mir::BasicBlock_*>_>::
          operator[](&pBVar1->preBlock,(long)local_e4);
          std::
          map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
          ::find(in_stack_fffffffffffffe48,(key_type *)0x27e26c);
          std::vector<int,_std::allocator<int>_>::vector
                    (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
          std::_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>::
          operator->((_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                      *)0x27e2b4);
          std::vector<int,_std::allocator<int>_>::vector
                    (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
          vectors_intersection(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
          std::vector<int,_std::allocator<int>_>::operator=
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe60._M_node,__x);
          std::vector<int,_std::allocator<int>_>::~vector
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe60._M_node);
          std::vector<int,_std::allocator<int>_>::~vector
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe60._M_node);
          std::vector<int,_std::allocator<int>_>::~vector
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe60._M_node);
          local_e4 = local_e4 + 1;
        }
        std::vector<int,_std::allocator<int>_>::vector
                  (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
        std::vector<int,_std::allocator<int>_>::vector
                  (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
        vectors_set_union(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe60._M_node);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe60._M_node);
        bVar2 = true;
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe60._M_node);
      }
    }
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe60._M_node);
    if (bVar2) {
      return in_RDI;
    }
  }
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x27e4a1);
  return in_RDI;
}

Assistant:

vector<int> pred_intersection(map<int, BasicBlock*> nodes, int n,
                              map<int, vector<int>> dom) {
  // intersect dom of all direct precursor nodes of n and merged with dom of n
  map<int, BasicBlock*>::iterator it = nodes.find(n);
  // cout << "$$" << n << endl;
  if (it != nodes.end()) {
    BasicBlock* b = it->second;
    map<int, vector<int>>::iterator iter = dom.find(n);
    vector<int> v1 = iter->second;
    // cout << "$$" << b->preBlock.size() << endl;
    if (b->preBlock.size() == 1) {
      iter = dom.find(b->preBlock[0]->id);
      v1 = vectors_set_union(v1, iter->second);
      // cout << b->id << "**" << v1[0] << endl;
      return v1;
    } else if (b->preBlock.size() >= 2) {
      iter = dom.find(b->preBlock[0]->id);
      vector<int> v2 = iter->second;
      for (int i = 1; i < b->preBlock.size(); i++) {
        iter = dom.find(b->preBlock[i]->id);
        v2 = vectors_intersection(v2, iter->second);
      }
      return vectors_set_union(v1, v2);
    } else {
      // error
    }
  }
  vector<int> v;
  return v;
}